

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

AsyncIoContext * kj::setupAsyncIo(void)

{
  LowLevelAsyncIoProviderImpl *this;
  AsyncIoProviderImpl *this_00;
  AsyncIoContext *in_RDI;
  Own<kj::(anonymous_namespace)::LowLevelAsyncIoProviderImpl> lowLevel;
  Own<kj::(anonymous_namespace)::AsyncIoProviderImpl> local_30;
  
  this = (LowLevelAsyncIoProviderImpl *)operator_new(0x130);
  anon_unknown_30::LowLevelAsyncIoProviderImpl::LowLevelAsyncIoProviderImpl(this);
  lowLevel.disposer =
       (Disposer *)
       &_::HeapDisposer<kj::(anonymous_namespace)::LowLevelAsyncIoProviderImpl>::instance;
  lowLevel.ptr = this;
  this_00 = (AsyncIoProviderImpl *)operator_new(0x78);
  anon_unknown_30::AsyncIoProviderImpl::AsyncIoProviderImpl(this_00,(LowLevelAsyncIoProvider *)this)
  ;
  local_30.disposer =
       (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::AsyncIoProviderImpl>::instance;
  (in_RDI->lowLevelProvider).disposer =
       (Disposer *)
       &_::HeapDisposer<kj::(anonymous_namespace)::LowLevelAsyncIoProviderImpl>::instance;
  lowLevel.ptr = (LowLevelAsyncIoProviderImpl *)0x0;
  (in_RDI->lowLevelProvider).ptr = (LowLevelAsyncIoProvider *)this;
  local_30.ptr = (AsyncIoProviderImpl *)0x0;
  (in_RDI->provider).disposer =
       (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::AsyncIoProviderImpl>::instance;
  (in_RDI->provider).ptr = (AsyncIoProvider *)this_00;
  in_RDI->waitScope = &this->waitScope;
  in_RDI->unixEventPort = &this->eventPort;
  Own<kj::(anonymous_namespace)::AsyncIoProviderImpl>::~Own(&local_30);
  Own<kj::(anonymous_namespace)::LowLevelAsyncIoProviderImpl>::~Own(&lowLevel);
  return in_RDI;
}

Assistant:

AsyncIoContext setupAsyncIo() {
  auto lowLevel = heap<LowLevelAsyncIoProviderImpl>();
  auto ioProvider = kj::heap<AsyncIoProviderImpl>(*lowLevel);
  auto& waitScope = lowLevel->getWaitScope();
  auto& eventPort = lowLevel->getEventPort();
  return { kj::mv(lowLevel), kj::mv(ioProvider), waitScope, eventPort };
}